

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  long lVar3;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  uint local_1c;
  Simd<unsigned_int,_(unsigned_char)__x04_> local_18;
  
  RVar1 = Load<unsigned_int>(this,instr,&local_1c,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    lVar3 = 0;
    do {
      *(uint *)((long)local_18.v + lVar3) = local_1c;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,local_18);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}